

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_sector.cpp
# Opt level: O0

double ON_SubDSectorType::CornerSectorAngleRadiansFromEdges
                 (ON_SubDEdgePtr sector_boundary_edge0_ptr,ON_SubDEdgePtr sector_boundary_edge1_ptr)

{
  long lVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  ulong uVar5;
  ulong uVar6;
  double local_e8;
  double alpha;
  double trig_one_tol;
  double trig_zero_tol;
  double local_b8;
  double sin_alpha;
  double cos_alpha;
  ON_3dVector B;
  ON_3dVector A;
  double *endP [2];
  double *cornerP;
  ON_SubDVertex *corner_vertex;
  ON_SubDVertex *V [2];
  ON__UINT_PTR edge_ends [2];
  ON_SubDEdge *edges [2];
  ON_SubDEdgePtr sector_boundary_edge1_ptr_local;
  ON_SubDEdgePtr sector_boundary_edge0_ptr_local;
  
  uVar5 = sector_boundary_edge0_ptr.m_ptr & 0xfffffffffffffff8;
  uVar6 = sector_boundary_edge1_ptr.m_ptr & 0xfffffffffffffff8;
  if ((uVar5 == 0) || (uVar6 == 0)) {
    ON_SubDIncrementErrorCount();
    sector_boundary_edge0_ptr_local.m_ptr = (ON__UINT_PTR)-9991.0;
  }
  else if (uVar5 == uVar6) {
    sector_boundary_edge0_ptr_local.m_ptr = (ON__UINT_PTR)6.19591884457987;
  }
  else {
    lVar1 = *(long *)(uVar5 + 0x80 + (1 - (sector_boundary_edge0_ptr.m_ptr & 1)) * 8);
    lVar2 = *(long *)(uVar6 + 0x80 + (1 - (sector_boundary_edge1_ptr.m_ptr & 1)) * 8);
    if ((lVar1 == 0) || (lVar2 == 0)) {
      ON_SubDIncrementErrorCount();
      sector_boundary_edge0_ptr_local.m_ptr = (ON__UINT_PTR)-9991.0;
    }
    else {
      lVar3 = *(long *)(uVar5 + 0x80 + (sector_boundary_edge0_ptr.m_ptr & 1) * 8);
      if ((lVar3 == 0) ||
         (lVar3 != *(long *)(uVar6 + 0x80 + (sector_boundary_edge1_ptr.m_ptr & 1) * 8))) {
        ON_SubDIncrementErrorCount();
        sector_boundary_edge0_ptr_local.m_ptr = (ON__UINT_PTR)-9991.0;
      }
      else {
        ON_3dVector::ON_3dVector
                  ((ON_3dVector *)&B.z,*(double *)(lVar1 + 0x80) - *(double *)(lVar3 + 0x80),
                   *(double *)(lVar1 + 0x88) - *(double *)(lVar3 + 0x88),
                   *(double *)(lVar1 + 0x90) - *(double *)(lVar3 + 0x90));
        ON_3dVector::ON_3dVector
                  ((ON_3dVector *)&cos_alpha,*(double *)(lVar2 + 0x80) - *(double *)(lVar3 + 0x80),
                   *(double *)(lVar2 + 0x88) - *(double *)(lVar3 + 0x88),
                   *(double *)(lVar2 + 0x90) - *(double *)(lVar3 + 0x90));
        ON_3dVector::Unitize((ON_3dVector *)&B.z);
        ON_3dVector::Unitize((ON_3dVector *)&cos_alpha);
        sin_alpha = ON_3dVector::operator*((ON_3dVector *)&B.z,(ON_3dVector *)&cos_alpha);
        ON_CrossProduct((ON_3dVector *)&trig_zero_tol,(ON_3dVector *)&B.z,(ON_3dVector *)&cos_alpha)
        ;
        local_b8 = ON_3dVector::Length((ON_3dVector *)&trig_zero_tol);
        if (local_b8 < 0.0) {
          ON_SubDIncrementErrorCount();
          sector_boundary_edge0_ptr_local.m_ptr = (ON__UINT_PTR)-9991.0;
        }
        else {
          if (ABS(sin_alpha) <= 0.002) {
            sin_alpha = 0.0;
          }
          if (ABS(local_b8) <= 0.002) {
            local_b8 = 0.0;
          }
          if (ABS((sin_alpha * sin_alpha + local_b8 * local_b8) - 1.0) <= 0.125) {
            if (((sin_alpha == 0.0) && (!NAN(sin_alpha))) || (0.999 <= ABS(local_b8))) {
              local_e8 = 1.5707963267948966;
            }
            else if (((local_b8 == 0.0) && (!NAN(local_b8))) || (0.999 <= ABS(sin_alpha))) {
              local_e8 = (double)(-(ulong)(sin_alpha < 0.0) & 0x400921fb54442d18);
            }
            else {
              local_e8 = atan2(local_b8,sin_alpha);
              bVar4 = ON_IsValid(local_e8);
              if (!bVar4) {
                ON_SubDIncrementErrorCount();
                return -9991.0;
              }
            }
            if ((0.0 <= local_e8) && (local_e8 <= 3.141592653589794)) {
              if (0.08726646259971647 < local_e8) {
                if (local_e8 < 6.19591884457987) {
                  if (ABS(local_e8 - 3.141592653589793) <= 0.002) {
                    local_e8 = 3.141592653589793;
                  }
                }
                else {
                  local_e8 = 6.19591884457987;
                }
              }
              else {
                local_e8 = 0.08726646259971647;
              }
              return local_e8;
            }
          }
          ON_SubDIncrementErrorCount();
          sector_boundary_edge0_ptr_local.m_ptr = (ON__UINT_PTR)-9991.0;
        }
      }
    }
  }
  return (double)sector_boundary_edge0_ptr_local.m_ptr;
}

Assistant:

double ON_SubDSectorType::CornerSectorAngleRadiansFromEdges(
  ON_SubDEdgePtr sector_boundary_edge0_ptr,
  ON_SubDEdgePtr sector_boundary_edge1_ptr
  )
{
  const ON_SubDEdge* edges[2] = { ON_SUBD_EDGE_POINTER(sector_boundary_edge0_ptr.m_ptr), ON_SUBD_EDGE_POINTER(sector_boundary_edge1_ptr.m_ptr) };
  if (nullptr == edges[0] || nullptr == edges[1])
    return ON_SUBD_RETURN_ERROR(ON_SubDSectorType::ErrorCornerSectorAngle);

  if (edges[0] == edges[1])
  {
    // occurs in nonmanifold cases like RH-49843
    // When an interior nonmanifold edge terminates a corner
    // and is the only crease edge is a sector for some
    // faces attached to the edge. 
    return ON_SubDSectorType::MaximumCornerAngleRadians;
    //return ON_SUBD_RETURN_ERROR(0.0);
  }

  ON__UINT_PTR edge_ends[2] = { ON_SUBD_EDGE_DIRECTION(sector_boundary_edge0_ptr.m_ptr), ON_SUBD_EDGE_DIRECTION(sector_boundary_edge1_ptr.m_ptr) };

  const ON_SubDVertex* V[2] = { edges[0]->m_vertex[1 - edge_ends[0]], edges[1]->m_vertex[1 - edge_ends[1]] };
  if (nullptr == V[0] || nullptr == V[1])
    return ON_SUBD_RETURN_ERROR(ON_SubDSectorType::ErrorCornerSectorAngle);

  const ON_SubDVertex* corner_vertex = edges[0]->m_vertex[edge_ends[0]];
  if (nullptr == corner_vertex || corner_vertex != edges[1]->m_vertex[edge_ends[1]])
    return ON_SUBD_RETURN_ERROR(ON_SubDSectorType::ErrorCornerSectorAngle);

  const double* cornerP = corner_vertex->m_P;

  const double* endP[2] = { V[0]->m_P, V[1]->m_P };

  // A = vector from cornerP to endP[0]
  ON_3dVector A(endP[0][0] - cornerP[0], endP[0][1] - cornerP[1], endP[0][2] - cornerP[2]);
  // B = vector from cornerP to endP[1]
  ON_3dVector B(endP[1][0] - cornerP[0], endP[1][1] - cornerP[1], endP[1][2] - cornerP[2]);

  // Unitize A and B
  A.Unitize();
  B.Unitize();

  // calculate angle between A and B
  // In reality, we will be lucky if we get 3 digits of precision in the trig functions
  // using the dot and cross of unitized differences.
  double cos_alpha = A*B;
  double sin_alpha = ON_CrossProduct(A, B).Length(); // NOTE WELL: sin_alpha >= 0.0 or is invalid
  if (sin_alpha < 0.0)
    return ON_SUBD_RETURN_ERROR(ON_SubDSectorType::ErrorCornerSectorAngle);
  
  const double trig_zero_tol = 0.002;
  if (fabs(cos_alpha) <= trig_zero_tol)
    cos_alpha = 0.0;
  if (fabs(sin_alpha) <= trig_zero_tol)
    sin_alpha = 0.0;

  if ( fabs(cos_alpha*cos_alpha + sin_alpha*sin_alpha - 1.0) <= 0.125 )
  {
    // valid sin and cos and no NaNs
    const double trig_one_tol = 0.999;
    double alpha = ON_DBL_QNAN;

    if ( 0.0 == cos_alpha || fabs(sin_alpha) >= trig_one_tol)
      alpha = 0.5*ON_PI;
    else if ( 0.0 == sin_alpha || fabs(cos_alpha) >= trig_one_tol)
      alpha = (cos_alpha < 0.0) ? ON_PI : 0.0;
    else
    {
      alpha = atan2(sin_alpha, cos_alpha);

      // sin_alpha >= 0 and no NaNs means this should never happen
      if (!ON_IsValid(alpha))
        return ON_SUBD_RETURN_ERROR(ON_SubDSectorType::ErrorCornerSectorAngle);
    }

    // sin_alpha >= 0 and no NaNs means this should always be true
    if (alpha >= 0.0 && alpha <= (1.0 + ON_EPSILON) * ON_PI)
    {
      if (alpha <= ON_SubDSectorType::MinimumCornerAngleRadians)
        alpha = ON_SubDSectorType::MinimumCornerAngleRadians;
      else if (alpha >= ON_SubDSectorType::MaximumCornerAngleRadians)
        alpha = ON_SubDSectorType::MaximumCornerAngleRadians;
      else if (fabs(alpha - ON_PI) <= 0.002)
      {
        // straight "corner"
        alpha = ON_PI;
      }

      return alpha;
    }
  }

  return ON_SUBD_RETURN_ERROR(ON_SubDSectorType::ErrorCornerSectorAngle);
}